

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

string * __thiscall
t_go_generator::module_name_abi_cxx11_
          (string *__return_storage_ptr__,t_go_generator *this,t_type *ttype)

{
  t_program *ptVar1;
  byte bVar2;
  t_go_generator *ptVar3;
  mapped_type *pmVar4;
  t_program *program_00;
  bool local_1a9;
  allocator local_179;
  undefined1 local_178 [8];
  string module;
  string local_150;
  string local_130;
  byte local_10c;
  byte local_10b;
  byte local_10a;
  allocator local_109;
  string local_108;
  string local_e8;
  byte local_c4;
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0;
  string local_a0;
  allocator local_69;
  string local_68;
  string local_48;
  t_go_generator *local_28;
  t_program *program;
  t_type *ttype_local;
  t_go_generator *this_local;
  
  program = (t_program *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_go_generator *)__return_storage_ptr__;
  ptVar3 = (t_go_generator *)t_type::get_program(ttype);
  local_28 = ptVar3;
  if ((ptVar3 != (t_go_generator *)0x0) &&
     (ptVar3 != (t_go_generator *)(this->super_t_generator).program_)) {
    std::allocator<char>::allocator();
    local_c2 = 0;
    local_c3 = 0;
    local_c4 = 0;
    local_10a = 0;
    local_10b = 0;
    local_10c = 0;
    module.field_2._M_local_buf[0xe] = '\0';
    module.field_2._M_local_buf[0xd] = '\0';
    module.field_2._M_local_buf[0xc] = '\0';
    std::__cxx11::string::string((string *)&local_68,"go",&local_69);
    t_program::get_namespace(&local_48,(t_program *)ptVar3,&local_68);
    bVar2 = std::__cxx11::string::empty();
    local_1a9 = true;
    if ((bVar2 & 1) == 0) {
      ptVar1 = (this->super_t_generator).program_;
      std::allocator<char>::allocator();
      local_c2 = 1;
      std::__cxx11::string::string((string *)&local_c0,"go",&local_c1);
      local_c3 = 1;
      t_program::get_namespace(&local_a0,ptVar1,&local_c0);
      local_c4 = 1;
      bVar2 = std::__cxx11::string::empty();
      ptVar3 = local_28;
      local_1a9 = true;
      if ((bVar2 & 1) == 0) {
        std::allocator<char>::allocator();
        local_10a = 1;
        std::__cxx11::string::string((string *)&local_108,"go",&local_109);
        local_10b = 1;
        t_program::get_namespace(&local_e8,(t_program *)ptVar3,&local_108);
        local_10c = 1;
        ptVar1 = (this->super_t_generator).program_;
        std::allocator<char>::allocator();
        module.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string
                  ((string *)&local_150,"go",(allocator *)(module.field_2._M_local_buf + 0xf));
        module.field_2._M_local_buf[0xd] = '\x01';
        t_program::get_namespace(&local_130,ptVar1,&local_150);
        module.field_2._M_local_buf[0xc] = '\x01';
        local_1a9 = std::operator!=(&local_e8,&local_130);
      }
    }
    if ((module.field_2._M_local_buf[0xc] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_130);
    }
    if ((module.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    if ((module.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(module.field_2._M_local_buf + 0xf));
    }
    if ((local_10c & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_e8);
    }
    if ((local_10b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_108);
    }
    if ((local_10a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    if ((local_c4 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    if ((local_c3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c0);
    }
    if ((local_c2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if (local_1a9 != false) {
      get_real_go_module_abi_cxx11_((string *)local_178,local_28,program_00);
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->package_identifiers_,(string *)local_178);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar4);
      std::__cxx11::string::~string((string *)local_178);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_179);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  return __return_storage_ptr__;
}

Assistant:

string t_go_generator::module_name(t_type* ttype) {
  t_program* program = ttype->get_program();

  if (program != nullptr && program != program_) {
    if (program->get_namespace("go").empty() ||
        program_->get_namespace("go").empty() ||
        program->get_namespace("go") != program_->get_namespace("go")) {
      string module(get_real_go_module(program));
      return package_identifiers_[module];
    }
  }

  return "";
}